

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::DataTable
          (DataTable *this,ClientContext *context,DataTable *parent,idx_t removed_column)

{
  shared_ptr<duckdb::DataTableInfo,_true> *this_00;
  pointer pCVar1;
  pointer puVar2;
  DataTable *pDVar3;
  bool bVar4;
  DataTableInfo *pDVar5;
  type pIVar6;
  reference this_01;
  RowGroupCollection *col_idx;
  CatalogException *pCVar7;
  ulong *puVar8;
  idx_t i;
  ulong uVar9;
  pointer this_02;
  pointer this_03;
  storage_t storage_oid;
  allocator local_139;
  pthread_mutex_t *local_138;
  vector<duckdb::ColumnDefinition,_true> *local_130;
  DataTable *local_128;
  shared_ptr<duckdb::RowGroupCollection,_true> *local_120;
  LocalStorage *local_118;
  ClientContext *local_110;
  ColumnDefinition local_108;
  
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->db = parent->db;
  this_00 = &this->info;
  ::std::__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)&parent->info);
  local_130 = &this->column_definitions;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__align = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version)._M_i = MAIN_TABLE;
  local_110 = context;
  local_118 = LocalStorage::Get(context,this->db);
  local_138 = (pthread_mutex_t *)&parent->append_lock;
  ::std::mutex::lock((mutex *)&local_138->__data);
  local_120 = &this->row_groups;
  pCVar1 = (parent->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_128 = parent;
  for (this_02 = (parent->column_definitions).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pCVar1; this_02 = this_02 + 1
      ) {
    ColumnDefinition::Copy(&local_108,this_02);
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::
    emplace_back<duckdb::ColumnDefinition>
              (&local_130->
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>,
               &local_108);
    ColumnDefinition::~ColumnDefinition(&local_108);
  }
  pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  DataTableInfo::InitializeIndexes(pDVar5,local_110,(char *)0x0);
  pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  ::std::mutex::lock(&(pDVar5->indexes).indexes_lock);
  this_03 = (pDVar5->indexes).indexes.
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pDVar5->indexes).indexes.
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_03 == puVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)&pDVar5->indexes);
      vector<duckdb::ColumnDefinition,_true>::erase_at(local_130,removed_column);
      storage_oid = 0;
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)(this->column_definitions).
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 .
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->column_definitions).
                                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                .
                                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
          uVar9 = uVar9 + 1) {
        this_01 = vector<duckdb::ColumnDefinition,_true>::get<true>(local_130,uVar9);
        ColumnDefinition::SetOid(this_01,uVar9);
        bVar4 = ColumnDefinition::Generated(this_01);
        if (!bVar4) {
          ColumnDefinition::SetStorageOid(this_01,storage_oid);
          storage_oid = storage_oid + 1;
        }
      }
      col_idx = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&local_128->row_groups);
      RowGroupCollection::RemoveColumn((RowGroupCollection *)&local_108,(idx_t)col_idx);
      shared_ptr<duckdb::RowGroupCollection,_true>::operator=
                (local_120,(shared_ptr<duckdb::RowGroupCollection,_true> *)&local_108);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108.name._M_string_length);
      pDVar3 = local_128;
      LocalStorage::DropColumn(local_118,local_128,this,removed_column);
      LOCK();
      (pDVar3->version)._M_i = ALTERED;
      UNLOCK();
      pthread_mutex_unlock(local_138);
      return;
    }
    pIVar6 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*(this_03)
    ;
    puVar8 = (pIVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (puVar8 != (pIVar6->column_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
      uVar9 = *puVar8;
      if (uVar9 == removed_column) {
        pCVar7 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_108,"Cannot drop this column: an index depends on it!",
                   &local_139);
        CatalogException::CatalogException(pCVar7,&local_108.name);
        __cxa_throw(pCVar7,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      puVar8 = puVar8 + 1;
      if (removed_column < uVar9) {
        pCVar7 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_108,
                   "Cannot drop this column: an index depends on a column after it!",&local_139);
        CatalogException::CatalogException(pCVar7,&local_108.name);
        __cxa_throw(pCVar7,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    this_03 = this_03 + 1;
  } while( true );
}

Assistant:

DataTable::DataTable(ClientContext &context, DataTable &parent, idx_t removed_column)
    : db(parent.db), info(parent.info), version(DataTableVersion::MAIN_TABLE) {
	// prevent any new tuples from being added to the parent
	auto &local_storage = LocalStorage::Get(context, db);
	lock_guard<mutex> parent_lock(parent.append_lock);

	for (auto &column_def : parent.column_definitions) {
		column_definitions.emplace_back(column_def.Copy());
	}

	info->InitializeIndexes(context);

	// first check if there are any indexes that exist that point to the removed column
	info->indexes.Scan([&](Index &index) {
		for (auto &column_id : index.GetColumnIds()) {
			if (column_id == removed_column) {
				throw CatalogException("Cannot drop this column: an index depends on it!");
			} else if (column_id > removed_column) {
				throw CatalogException("Cannot drop this column: an index depends on a column after it!");
			}
		}
		return false;
	});

	// erase the column definitions from this DataTable
	D_ASSERT(removed_column < column_definitions.size());
	column_definitions.erase_at(removed_column);

	storage_t storage_idx = 0;
	for (idx_t i = 0; i < column_definitions.size(); i++) {
		auto &col = column_definitions[i];
		col.SetOid(i);
		if (col.Generated()) {
			continue;
		}
		col.SetStorageOid(storage_idx++);
	}

	// alter the row_groups and remove the column from each of them
	this->row_groups = parent.row_groups->RemoveColumn(removed_column);

	// scan the original table, and fill the new column with the transformed value
	local_storage.DropColumn(parent, *this, removed_column);

	// this table replaces the previous table, hence the parent is no longer the root DataTable
	parent.version = DataTableVersion::ALTERED;
}